

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_setstr(lua_State *L,GCtab *t,GCstr *key)

{
  TValue *pTVar1;
  ulong in_RDX;
  long in_RSI;
  Node *n;
  TValue k;
  Node *n_1;
  TValue *local_b0;
  cTValue *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  
  local_b0 = (TValue *)
             (&((GCtab *)(ulong)*(uint *)(in_RSI + 0x14))->nextgc +
             (ulong)(*(uint *)(in_RDX + 8) & *(uint *)(in_RSI + 0x1c)) * 6);
  while ((((GCRef *)((long)local_b0 + 0xc))->gcptr32 != 0xfffffffb || (local_b0[1].u32.lo != in_RDX)
         )) {
    local_b0 = (TValue *)(ulong)local_b0[2].u32.lo;
    if (local_b0 == (TValue *)0x0) {
      pTVar1 = lj_tab_newkey((lua_State *)CONCAT44(*(uint *)(in_RDX + 8),in_stack_ffffffffffffff88),
                             (GCtab *)(ulong)*(uint *)(in_RSI + 0x14),in_stack_ffffffffffffff78);
      return pTVar1;
    }
  }
  return local_b0;
}

Assistant:

TValue *lj_tab_setstr(lua_State *L, GCtab *t, GCstr *key)
{
  TValue k;
  Node *n = hashstr(t, key);
  do {
    if (tvisstr(&n->key) && strV(&n->key) == key)
      return &n->val;
  } while ((n = nextnode(n)));
  setstrV(L, &k, key);
  return lj_tab_newkey(L, t, &k);
}